

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

int mcpl_actual_can_merge(mcpl_file_t ff1,mcpl_file_t ff2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((((*(long *)((long)ff1.internal + 0x80) == *(long *)((long)ff2.internal + 0x80)) &&
       (iVar3 = strcmp(*(char **)((long)ff1.internal + 0x10),*(char **)((long)ff2.internal + 0x10)),
       iVar3 == 0)) && (*(int *)((long)ff1.internal + 0x1c) == *(int *)((long)ff2.internal + 0x1c)))
     && (((*(int *)((long)ff1.internal + 0x20) == *(int *)((long)ff2.internal + 0x20) &&
          (*(int *)((long)ff1.internal + 0x24) == *(int *)((long)ff2.internal + 0x24))) &&
         (*(int *)((long)ff1.internal + 0x28) == *(int *)((long)ff2.internal + 0x28))))) {
    if (((*(double *)((long)ff1.internal + 0x30) == *(double *)((long)ff2.internal + 0x30)) &&
        (!NAN(*(double *)((long)ff1.internal + 0x30)) &&
         !NAN(*(double *)((long)ff2.internal + 0x30)))) &&
       ((*(int *)((long)ff1.internal + 0x38) == *(int *)((long)ff2.internal + 0x38) &&
        (((*(int *)((long)ff1.internal + 0x78) == *(int *)((long)ff2.internal + 0x78) &&
          (uVar1 = *(uint *)((long)ff1.internal + 0x48),
          uVar1 == *(uint *)((long)ff2.internal + 0x48))) &&
         (uVar2 = *(uint *)((long)ff1.internal + 0x58),
         uVar2 == *(uint *)((long)ff2.internal + 0x58))))))) {
      uVar4 = 0;
      do {
        if (uVar1 == uVar4) {
          uVar4 = 0;
          do {
            if (uVar2 == uVar4) {
              return 1;
            }
            uVar1 = *(uint *)(*(long *)((long)ff1.internal + 0x68) + uVar4 * 4);
            if (uVar1 != *(uint *)(*(long *)((long)ff2.internal + 0x68) + uVar4 * 4)) {
              return 0;
            }
            iVar3 = strcmp(*(char **)(*(long *)((long)ff1.internal + 0x60) + uVar4 * 8),
                           *(char **)(*(long *)((long)ff2.internal + 0x60) + uVar4 * 8));
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = bcmp(*(void **)(*(long *)((long)ff1.internal + 0x70) + uVar4 * 8),
                         *(void **)(*(long *)((long)ff2.internal + 0x70) + uVar4 * 8),(ulong)uVar1);
            uVar4 = uVar4 + 1;
          } while (iVar3 == 0);
          return 0;
        }
        iVar3 = strcmp(*(char **)(*(long *)((long)ff1.internal + 0x50) + uVar4 * 8),
                       *(char **)(*(long *)((long)ff2.internal + 0x50) + uVar4 * 8));
        uVar4 = uVar4 + 1;
      } while (iVar3 == 0);
    }
  }
  return 0;
}

Assistant:

MCPL_LOCAL int mcpl_actual_can_merge(mcpl_file_t ff1, mcpl_file_t ff2)
{
  mcpl_fileinternal_t * f1 = (mcpl_fileinternal_t *)ff1.internal;
  mcpl_fileinternal_t * f2 = (mcpl_fileinternal_t *)ff2.internal;
  assert(f1);
  assert(f2);
  if (f1->first_particle_pos!=f2->first_particle_pos)
    return 0;//different header

  //Note, we do not check the format_version field here, since mcpl_merge_files
  //can actually work on files with different versions.

  //Very strict checking of everything except nparticles. Even order of blobs
  //and comments must be preserved (could possibly be relaxed a bit):
  if (strcmp(f1->hdr_srcprogname,f2->hdr_srcprogname)!=0) return 0;
  if (f1->opt_userflags!=f2->opt_userflags) return 0;
  if (f1->opt_polarisation!=f2->opt_polarisation) return 0;
  if (f1->opt_singleprec!=f2->opt_singleprec) return 0;
  if (f1->opt_universalpdgcode!=f2->opt_universalpdgcode) return 0;
  if (f1->opt_universalweight!=f2->opt_universalweight) return 0;
  if (f1->is_little_endian!=f2->is_little_endian) return 0;
  if (f1->particle_size!=f2->particle_size) return 0;
  if (f1->ncomments!=f2->ncomments) return 0;
  if (f1->nblobs!=f2->nblobs) return 0;
  uint32_t i;
  for (i = 0; i<f1->ncomments; ++i) {
    if (strcmp(f1->comments[i],f2->comments[i])!=0) return 0;
  }
  for (i = 0; i<f1->nblobs; ++i) {
    if (f1->bloblengths[i]!=f2->bloblengths[i]) return 0;
    if (strcmp(f1->blobkeys[i],f2->blobkeys[i])!=0) return 0;
    if (memcmp(f1->blobs[i],f2->blobs[i],f1->bloblengths[i])!=0) return 0;
  }
  return 1;
}